

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

void __thiscall ADE_DEP_DPFSP::normalizza(ADE_DEP_DPFSP *this,Permutazione *p)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  ushort uVar5;
  void *pvVar6;
  undefined2 *puVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  
  uVar1 = (this->istanza).fabbriche;
  pvVar6 = operator_new__((ulong)((uint)uVar1 * 2));
  puVar7 = (undefined2 *)operator_new__((ulong)uVar1 * 4);
  *puVar7 = 0;
  uVar2 = p->dimensione;
  puVar7[(ulong)uVar1 * 2 + -1] = uVar2 - 1;
  uVar3 = (this->istanza).lavori;
  lVar10 = 0;
  uVar8 = 0;
  uVar13 = 0;
  do {
    lVar11 = lVar10;
    uVar5 = 0xffff;
LAB_001052fe:
    lVar10 = lVar11 + 1;
    uVar12 = uVar8 & 0xffff;
    if (lVar10 - (ulong)uVar2 == 1) {
      *(ushort *)((long)pvVar6 + uVar12 * 2) = uVar5;
      uVar13 = uVar1 - 1;
      uVar8 = 0;
      uVar12 = 0;
      if (0 < (int)uVar13) {
        uVar12 = (ulong)uVar13;
      }
      bVar15 = false;
LAB_0010537b:
      if (uVar8 == uVar12) {
        if (bVar15) {
          uVar8 = 0xffffffffffffffff;
          if ((uint)uVar3 + (uint)uVar1 != 0) {
            uVar8 = (long)(int)((uint)uVar3 + (uint)uVar1 + -1) * 2;
          }
          puVar9 = (unsigned_short *)operator_new__(uVar8);
          uVar14 = 0;
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            uVar2 = puVar7[uVar8 * 2];
            uVar5 = (puVar7[uVar8 * 2 + 1] - uVar2) + 1;
            if (uVar5 != 0) {
              uVar17 = uVar14 & 0xffff;
              uVar14 = uVar14 + uVar5;
              memcpy(puVar9 + uVar17,
                     (void *)((ulong)((uint)uVar2 + (uint)uVar2) + (long)p->individuo),
                     (ulong)((uint)uVar5 * 2));
            }
            if (uVar13 != uVar8) {
              uVar17 = uVar14 & 0xffff;
              uVar14 = uVar14 + 1;
              puVar9[uVar17] = uVar3 + (short)uVar8;
            }
          }
          if (p->individuo != (unsigned_short *)0x0) {
            operator_delete__(p->individuo);
          }
          p->individuo = puVar9;
        }
        operator_delete__(pvVar6);
        operator_delete__(puVar7);
        return;
      }
      uVar14 = (int)uVar8 * 2 & 0xffff;
      uVar17 = (int)uVar8 * 2 + 1U & 0xffff;
      uVar18 = uVar8;
      do {
        uVar21 = uVar18;
        uVar20 = (int)uVar18 * 2;
        do {
          uVar19 = uVar20;
          uVar18 = uVar21 + 1;
          if (uVar1 <= uVar18) {
            uVar8 = uVar8 + 1;
            goto LAB_0010537b;
          }
          uVar2 = *(ushort *)((long)pvVar6 + uVar8 * 2);
          uVar5 = *(ushort *)((long)pvVar6 + uVar21 * 2 + 2);
          uVar20 = uVar19 + 2;
          uVar21 = uVar18;
        } while (uVar2 <= uVar5);
        uVar4 = puVar7[uVar14];
        uVar20 = uVar20 & 0xffff;
        puVar7[uVar14] = puVar7[uVar20];
        puVar7[uVar20] = uVar4;
        uVar16 = (short)uVar19 + 3;
        uVar4 = puVar7[uVar17];
        puVar7[uVar17] = puVar7[uVar16];
        puVar7[uVar16] = uVar4;
        *(ushort *)((long)pvVar6 + uVar8 * 2) = uVar5;
        *(ushort *)((long)pvVar6 + uVar18 * 2) = uVar2;
        bVar15 = true;
      } while( true );
    }
    uVar16 = p->individuo[lVar11];
    if (uVar16 < uVar3) {
      lVar11 = lVar10;
      if (uVar16 < uVar5) {
        uVar5 = uVar16;
      }
      goto LAB_001052fe;
    }
    uVar8 = (ulong)((int)uVar12 + 1);
    *(ushort *)((long)pvVar6 + uVar12 * 2) = uVar5;
    puVar7[uVar13 & 0xffff | 1] = (short)lVar11 + -1;
    uVar13 = uVar13 + 2;
    puVar7[uVar13 & 0xffff] = (short)lVar10;
  } while( true );
}

Assistant:

void ADE_DEP_DPFSP::normalizza(Permutazione* p) {
	unsigned short* valoriMinimiF = new unsigned short[istanza.fabbriche];
	unsigned short* indiciFabbriche = new unsigned short[istanza.fabbriche * 2];

	indiciFabbriche[0] = 0;
	indiciFabbriche[istanza.fabbriche * 2 - 1] = p->dimensione - 1;

	unsigned short incremento = 0;

	unsigned short valoreMinimo = UINT16_MAX;
	unsigned short f = 0;

	for (unsigned short i = 0; i < p->dimensione; i++) {
		if (p->individuo[i] >= istanza.lavori) {
			valoriMinimiF[f++] = valoreMinimo;
			valoreMinimo = UINT16_MAX;
			indiciFabbriche[++incremento] = i - 1;
			indiciFabbriche[++incremento] = i + 1;
		}
		else {
			valoreMinimo = min(valoreMinimo, p->individuo[i]);
		}
	}
	valoriMinimiF[f] = valoreMinimo;

	bool cambiamento = false;
	for (unsigned short i = 0; i < istanza.fabbriche - 1; i++) {
		for (unsigned short j = i + 1; j < istanza.fabbriche; j++) {
			if (valoriMinimiF[i] > valoriMinimiF[j]) {

				cambiamento = true;

				unsigned short ind1 = 2 * i;
				unsigned short ind2 = 2 * j;

				//scambia indici fabbriche
				unsigned short tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				ind1++, ind2++;
				tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				//scambia indici minimi
				tmp = valoriMinimiF[i];
				valoriMinimiF[i] = valoriMinimiF[j];
				valoriMinimiF[j] = tmp;
			}
		}
	}

	if (cambiamento) {
		unsigned short* nuovoIndividuo = new unsigned short[istanza.lavori + istanza.fabbriche - 1];

		unsigned short posizione = 0;

		for (unsigned short i = 0; i < istanza.fabbriche; i++) {

			unsigned short dimensioneFabbrica = indiciFabbriche[2 * i + 1] - indiciFabbriche[2 * i] + 1;
			if (dimensioneFabbrica > 0) {
				memcpy(&nuovoIndividuo[posizione], &p->individuo[indiciFabbriche[2 * i]], 
					dimensioneFabbrica * sizeof(unsigned short));

				posizione += dimensioneFabbrica;
			}

			if(i!=istanza.fabbriche - 1)
				nuovoIndividuo[posizione++] = istanza.lavori + i;
		}

		delete[] p->individuo;
		p->individuo = nuovoIndividuo;
	}

	delete[] valoriMinimiF;
	delete[] indiciFabbriche;
}